

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

void skipSpaces(void)

{
  int iVar1;
  bool bVar2;
  
  while( true ) {
    bVar2 = true;
    if ((*p != ' ') && (bVar2 = true, *p != '\t')) {
      bVar2 = *p == '\n';
    }
    if (!bVar2) break;
    p = p + 1;
  }
  iVar1 = inputPosition + 1;
  if (*p == '\"') {
    do {
      p = p + 1;
      bVar2 = false;
      if (*p != '\0') {
        bVar2 = *p != '\"';
      }
    } while (bVar2);
    inputPosition = inputPosition + 3;
    if (*p != '\"') {
      parseError("unterminated comment");
    }
    p = p + 1;
    inputPosition = inputPosition + 1;
    skipSpaces();
    iVar1 = inputPosition;
  }
  inputPosition = iVar1;
  return;
}

Assistant:

void skipSpaces()
{
    while ((*p == ' ') || (*p == '\t') || (*p == '\n'))
        p++; inputPosition++;
    if (*p == '\"') {
        p++; inputPosition++;
        while (*p && (*p != '\"'))
            p++; inputPosition++;
        if (*p != '\"')
            parseError("unterminated comment");
        p++; inputPosition++;
        skipSpaces();
    }
}